

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall
embree::CommandLineParser::parseCommandLine
          (CommandLineParser *this,Ref<embree::ParseStream> *cin,FileName *path)

{
  CommandLineOption *pCVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  pointer ppVar5;
  ostream *poVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  char *pcVar8;
  undefined8 in_RDX;
  long *in_RSI;
  Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *in_RDI;
  iterator option;
  string tag0;
  string tag;
  ParseStream *in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  string local_128 [32];
  long *local_108;
  _Self local_100;
  _Self local_f8;
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  int local_90;
  string local_80 [32];
  undefined8 local_60;
  long **local_40;
  long **local_38;
  Ref<embree::CommandLineParser::CommandLineOption> *local_8;
  
  local_60 = in_RDX;
  do {
    ParseStream::getString_abi_cxx11_(in_stack_fffffffffffffe38);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                            (char *)in_stack_fffffffffffffe38);
    if (bVar2) {
      local_90 = 1;
    }
    else {
      std::__cxx11::string::string(local_b0,local_80);
      lVar4 = std::__cxx11::string::find((char *)local_80,0x5a5668);
      if (lVar4 == 0) {
        std::__cxx11::string::substr((ulong)local_d0,(ulong)local_80);
        std::__cxx11::string::operator=(local_80,local_d0);
        std::__cxx11::string::~string(local_d0);
        lVar4 = std::__cxx11::string::find((char *)local_80,0x5a5668);
        if (lVar4 == 0) {
          std::__cxx11::string::substr((ulong)local_f0,(ulong)local_80);
          std::__cxx11::string::operator=(local_80,local_f0);
          std::__cxx11::string::~string(local_f0);
        }
        local_f8._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
                     *)in_stack_fffffffffffffe38,(key_type *)0x1d2d3f);
        local_100._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
                    *)in_stack_fffffffffffffe38);
        bVar2 = std::operator!=(&local_f8,&local_100);
        if (!bVar2) goto LAB_001d2ed6;
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
                               *)0x1d2d97);
        local_8 = &ppVar5->second;
        pCVar1 = local_8->ptr;
        local_40 = &local_108;
        local_108 = (long *)*in_RSI;
        if (local_108 != (long *)0x0) {
          (**(code **)(*local_108 + 0x10))();
        }
        (*(pCVar1->super_RefCount)._vptr_RefCount[4])(pCVar1,&local_108,local_60);
        local_38 = &local_108;
        if (local_108 != (long *)0x0) {
          (**(code **)(*local_108 + 0x18))();
        }
        local_90 = 2;
      }
      else {
LAB_001d2ed6:
        if ((int)in_RDI[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i != 1) {
          poVar6 = std::operator<<((ostream *)&std::cerr,"unknown command line parameter: ");
          poVar6 = std::operator<<(poVar6,local_b0);
          std::operator<<(poVar6," ");
          while( true ) {
            Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::peek(in_RDI);
            bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40)
                                    ,(char *)in_stack_fffffffffffffe38);
            bVar2 = false;
            if (bVar3) {
              pbVar7 = Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::peek(in_RDI);
              pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)pbVar7);
              bVar2 = *pcVar8 != '-';
            }
            if (!bVar2) break;
            ParseStream::getString_abi_cxx11_(in_stack_fffffffffffffe38);
            poVar6 = std::operator<<((ostream *)&std::cerr,local_128);
            std::operator<<(poVar6," ");
            std::__cxx11::string::~string(local_128);
          }
          std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
        }
        local_90 = 0;
      }
      std::__cxx11::string::~string(local_b0);
    }
    std::__cxx11::string::~string(local_80);
    in_stack_fffffffffffffe44 = local_90;
    if ((local_90 != 0) && (local_90 == 1)) {
      return;
    }
  } while( true );
}

Assistant:

void CommandLineParser::parseCommandLine(Ref<ParseStream> cin, const FileName& path)
  {
    while (true)
    {
      std::string tag = cin->getString();
      if (tag == "") return;
      std::string tag0 = tag;
      
      /* remove - or -- and lookup command line option */
      if (tag.find("-") == 0) 
      {
        tag = tag.substr(1);
        if (tag.find("-") == 0) tag = tag.substr(1);
        auto option = commandLineOptionMap.find(tag);
      
        /* process command line option */
        if (option != commandLineOptionMap.end()) {
          option->second->parse(cin,path);
          continue;
        }
      }
      
      if (verbosity != SILENT) {
        /* handle unknown command line options */
        std::cerr << "unknown command line parameter: " << tag0 << " ";
        while (cin->peek() != "" && cin->peek()[0] != '-') std::cerr << cin->getString() << " ";
        std::cerr << std::endl;
      }
    }
  }